

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_0::Visitor<long>::AppendVariableDeclarationBegin(Visitor<long> *this)

{
  ostream *poVar1;
  VariableName name;
  
  poVar1 = Append(this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,"int64_t",7);
  poVar1 = std::operator<<(poVar1," ");
  name.no = this->lastVariableNo + 1;
  this->lastVariableNo = name.no;
  poVar1 = operator<<(poVar1,name);
  std::operator<<(poVar1," = ");
  return;
}

Assistant:

void AppendVariableDeclarationBegin()
    {
        Append() << TypeName<TNumber>() << " " << VariableName(++lastVariableNo) << " = ";
    }